

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_top_predictor_4x16_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2 = psadbw((undefined1  [16])0x0,ZEXT416(*(uint *)above));
  iVar1 = 0x10;
  do {
    *(uint *)dst = (auVar2._0_4_ + 2U >> 2 & 0xff) * 0x1010101;
    dst = (uint8_t *)((long)dst + stride);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static inline void dc_top_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                    int bh, const uint8_t *above,
                                    const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)left;

  for (i = 0; i < bw; i++) sum += above[i];
  expected_dc = (sum + (bw >> 1)) / bw;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}